

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

text_style * __thiscall fmt::v7::text_style::operator|=(text_style *this,text_style *rhs)

{
  format_error *pfVar1;
  text_style *rhs_local;
  text_style *this_local;
  
  if ((this->set_foreground_color & 1U) == 0) {
    this->set_foreground_color = (bool)(rhs->set_foreground_color & 1);
    this->foreground_color = rhs->foreground_color;
  }
  else if ((rhs->set_foreground_color & 1U) != 0) {
    if ((((this->foreground_color).is_rgb & 1U) == 0) ||
       (((rhs->foreground_color).is_rgb & 1U) == 0)) {
      pfVar1 = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(pfVar1,"can\'t OR a terminal color");
      __cxa_throw(pfVar1,&format_error::typeinfo,format_error::~format_error);
    }
    (this->foreground_color).value.rgb_color =
         (rhs->foreground_color).value.rgb_color | (this->foreground_color).value.rgb_color;
  }
  if ((this->set_background_color & 1U) == 0) {
    this->set_background_color = (bool)(rhs->set_background_color & 1);
    this->background_color = rhs->background_color;
  }
  else if ((rhs->set_background_color & 1U) != 0) {
    if ((((this->background_color).is_rgb & 1U) == 0) ||
       (((rhs->background_color).is_rgb & 1U) == 0)) {
      pfVar1 = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(pfVar1,"can\'t OR a terminal color");
      __cxa_throw(pfVar1,&format_error::typeinfo,format_error::~format_error);
    }
    (this->background_color).value.rgb_color =
         (rhs->background_color).value.rgb_color | (this->background_color).value.rgb_color;
  }
  this->ems = this->ems | rhs->ems;
  return this;
}

Assistant:

FMT_CONSTEXPR text_style& operator|=(const text_style& rhs) {
    if (!set_foreground_color) {
      set_foreground_color = rhs.set_foreground_color;
      foreground_color = rhs.foreground_color;
    } else if (rhs.set_foreground_color) {
      if (!foreground_color.is_rgb || !rhs.foreground_color.is_rgb)
        FMT_THROW(format_error("can't OR a terminal color"));
      foreground_color.value.rgb_color |= rhs.foreground_color.value.rgb_color;
    }

    if (!set_background_color) {
      set_background_color = rhs.set_background_color;
      background_color = rhs.background_color;
    } else if (rhs.set_background_color) {
      if (!background_color.is_rgb || !rhs.background_color.is_rgb)
        FMT_THROW(format_error("can't OR a terminal color"));
      background_color.value.rgb_color |= rhs.background_color.value.rgb_color;
    }

    ems = static_cast<emphasis>(static_cast<uint8_t>(ems) |
                                static_cast<uint8_t>(rhs.ems));
    return *this;
  }